

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpPrepass::OnImportGlobal
          (BinaryReaderObjdumpPrepass *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  BinaryReaderObjdumpPrepass *y;
  string_view x;
  string_view y_00;
  string local_90;
  string local_70;
  string_view local_50;
  undefined1 local_3d;
  Index local_3c;
  bool mutable__local;
  BinaryReaderObjdumpPrepass *pBStack_38;
  Index import_index_local;
  BinaryReaderObjdumpPrepass *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  y = (BinaryReaderObjdumpPrepass *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  local_3d = mutable_;
  x._M_str = ".";
  x._M_len = module_name_local._M_len;
  local_3c = import_index;
  pBStack_38 = this;
  this_local = y;
  operator+[abi_cxx11_(&local_90,(wabt *)field_name_local._M_str,x,(char *)y);
  y_00._M_str = (char *)y;
  y_00._M_len = field_name_local._M_len;
  operator+(&local_70,(wabt *)&local_90,(string *)this_local,y_00);
  local_50 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70);
  SetGlobalName(this,global_index,local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result OnImportGlobal(Index import_index,
                        std::string_view module_name,
                        std::string_view field_name,
                        Index global_index,
                        Type type,
                        bool mutable_) override {
    SetGlobalName(global_index, module_name + "." + field_name);
    return Result::Ok;
  }